

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dev_data.c
# Opt level: O0

void CreateGyroLogFile(void)

{
  tm *__tp;
  time_t local_90;
  time_t timer;
  char str_cwd [64];
  char str_data [64];
  
  local_90 = time((time_t *)0x0);
  __tp = localtime(&local_90);
  strftime(str_cwd + 0x38,0x40,"%Y-%m-%d[%H:%M:%S][GYRO]",__tp);
  strcat(GyroLogFileName,str_cwd + 0x38);
  strcat(GyroLogFileName,".txt");
  fd_gyro_log = (FILE *)fopen(GyroLogFileName,"w");
  if ((FILE *)fd_gyro_log == (FILE *)0x0) {
    printf("Failed to create gyro log file.\n");
  }
  return;
}

Assistant:

void CreateGyroLogFile(void)
{
	char str_data[64];
	char str_cwd[64];
	time_t timer = time(NULL);

	strftime(str_data, sizeof(str_data), "%Y-%m-%d[%H:%M:%S][GYRO]", localtime(&timer));
	strcat(GyroLogFileName, str_data);
	strcat(GyroLogFileName, ".txt");
	fd_gyro_log = fopen(GyroLogFileName, "w");

	if (fd_gyro_log == NULL)
	{
		printf("Failed to create gyro log file.\n");
	}
}